

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_source.hpp
# Opt level: O0

void __thiscall
ItemSourceReward::ItemSourceReward
          (ItemSourceReward *this,uint32_t address_in_rom,string *name,uint8_t reward_id,
          string *node_id,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *hints)

{
  allocator<char> local_59;
  string local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *hints_local;
  string *node_id_local;
  string *psStack_20;
  uint8_t reward_id_local;
  string *name_local;
  ItemSourceReward *pIStack_10;
  uint32_t address_in_rom_local;
  ItemSourceReward *this_local;
  
  local_38 = hints;
  hints_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)node_id;
  node_id_local._7_1_ = reward_id;
  psStack_20 = name;
  name_local._4_4_ = address_in_rom;
  pIStack_10 = this;
  ItemSource::ItemSource(&this->super_ItemSource,name,node_id,hints);
  (this->super_ItemSource)._vptr_ItemSource = (_func_int **)&PTR__ItemSourceReward_003c7638;
  this->_address_in_rom = name_local._4_4_;
  this->_reward_id = node_id_local._7_1_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"owned by someone willing to give it to the brave",&local_59);
  ItemSource::add_hint(&this->super_ItemSource,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return;
}

Assistant:

ItemSourceReward(uint32_t address_in_rom, const std::string& name, uint8_t reward_id, const std::string& node_id = "", const std::vector<std::string>& hints = {}) :
        ItemSource      (name, node_id, hints),
        _reward_id      (reward_id),
        _address_in_rom (address_in_rom)
    {
        this->add_hint("owned by someone willing to give it to the brave");
    }